

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void sendTempo(State *state)

{
  double quantum;
  double dVar1;
  UdpSender *this;
  Tempo TVar2;
  Beats BVar3;
  char *pcVar4;
  long lVar5;
  longlong lVar6;
  ostream *poVar7;
  OutboundPacketStream *pOVar8;
  size_t sVar9;
  microseconds time;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  double dVar10;
  OutboundPacketStream p;
  Timeline timeline;
  char buffer [1024];
  BeginMessage local_4c0;
  undefined1 local_4b8 [16];
  OutboundPacketStream local_4a8;
  long local_470;
  Timeline local_468;
  Timeline local_428 [42];
  
  ableton::link::
  Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>
  ::timeline(local_428,&(state->link).mController);
  local_468.mbRespectQuantum =
       (state->link).mController.mSessionPeerCounter.mSessionPeerCount.
       super___atomic_base<unsigned_long>._M_i != 0;
  local_468.mOriginalTimeline.timeOrigin.__r = local_428[0].timeOrigin.__r;
  local_468.mOriginalTimeline.tempo.super_tuple<double>.super__Tuple_impl<0UL,_double>.
  super__Head_base<0UL,_double,_false>._M_head_impl =
       local_428[0].tempo.super_tuple<double>.super__Tuple_impl<0UL,_double>.
       super__Head_base<0UL,_double,_false>._M_head_impl;
  local_468.mOriginalTimeline.beatOrigin.super_tuple<long>.super__Tuple_impl<0UL,_long>.
  super__Head_base<0UL,_long,_false>._M_head_impl =
       local_428[0].beatOrigin.super_tuple<long>.super__Tuple_impl<0UL,_long>.
       super__Head_base<0UL,_long,_false>._M_head_impl;
  local_468.mTimeline.tempo.super_tuple<double>.super__Tuple_impl<0UL,_double>.
  super__Head_base<0UL,_double,_false>._M_head_impl =
       local_428[0].tempo.super_tuple<double>.super__Tuple_impl<0UL,_double>.
       super__Head_base<0UL,_double,_false>._M_head_impl;
  local_468.mTimeline.beatOrigin.super_tuple<long>.super__Tuple_impl<0UL,_long>.
  super__Head_base<0UL,_long,_false>._M_head_impl =
       local_428[0].beatOrigin.super_tuple<long>.super__Tuple_impl<0UL,_long>.
       super__Head_base<0UL,_long,_false>._M_head_impl;
  local_468.mTimeline.timeOrigin.__r = local_428[0].timeOrigin.__r;
  quantum = state->quantum;
  clock_gettime(1,(timespec *)local_428);
  time.__r = (ulong)((long)local_428[0].tempo.super_tuple<double>.super__Tuple_impl<0UL,_double>.
                           super__Head_base<0UL,_double,_false>._M_head_impl * 1000000000 +
                    (long)local_428[0].beatOrigin.super_tuple<long>.super__Tuple_impl<0UL,_long>.
                          super__Head_base<0UL,_long,_false>._M_head_impl) / 1000;
  pcVar4 = (char *)llround(quantum * 1000000.0);
  BVar3.super_tuple<long>.super__Tuple_impl<0UL,_long>.super__Head_base<0UL,_long,_false>.
  _M_head_impl = (tuple<long>)(tuple<long>)local_468.mTimeline.beatOrigin;
  lVar5 = time.__r - local_468.mTimeline.timeOrigin.__r;
  lVar6 = llround(60000000.0 /
                  (double)local_468.mTimeline.tempo.super_tuple<double>.
                          super__Tuple_impl<0UL,_double>.super__Head_base<0UL,_double,_false>.
                          _M_head_impl);
  local_4a8.data_ = (char *)llround(((double)lVar5 / (double)lVar6) * 1000000.0);
  local_428[0].tempo.super_tuple<double>.super__Tuple_impl<0UL,_double>.
  super__Head_base<0UL,_double,_false>._M_head_impl =
       (tuple<double>)
       ((long)BVar3.super_tuple<long>.super__Tuple_impl<0UL,_long>.
              super__Head_base<0UL,_long,_false>._M_head_impl + (long)local_4a8.data_);
  local_4c0.addressPattern = pcVar4;
  ableton::link::closestPhaseMatch
            ((link *)&local_470,(Beats *)local_428,(Beats *)&local_4a8,(Beats *)&local_4c0);
  ableton::Link::Timeline::phaseAtTime(&local_468,time,quantum);
  TVar2.super_tuple<double>.super__Tuple_impl<0UL,_double>.super__Head_base<0UL,_double,_false>.
  _M_head_impl = (tuple<double>)(tuple<double>)local_468.mTimeline.tempo;
  if (sendTempo::diff == 0) {
    lVar5 = std::chrono::_V2::system_clock::now();
    sendTempo::diff = ((lVar5 / 1000000) * 1000 - time.__r) + 500;
  }
  dVar10 = (double)(sendTempo::diff + time.__r) / 1000000.0 + -0.2;
  dVar1 = floor(dVar10);
  local_4b8._8_4_ = extraout_XMM0_Dc;
  local_4b8._0_8_ = dVar1;
  local_4b8._12_4_ = extraout_XMM0_Dd;
  dVar1 = floor((dVar10 - (double)(int)dVar1) * 1000000.0);
  osc::OutboundPacketStream::OutboundPacketStream(&local_4a8,(char *)local_428,0x400);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\nnew cps: ",10);
  dVar10 = ((double)TVar2.super_tuple<double>.super__Tuple_impl<0UL,_double>.
                    super__Head_base<0UL,_double,_false>._M_head_impl / quantum) / 60.0;
  poVar7 = std::ostream::_M_insert<double>(dVar10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," | last cps: ",0xd);
  poVar7 = std::ostream::_M_insert<double>(sendTempo::last_cps);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
  local_4c0.addressPattern = "/tempo";
  sendTempo::last_cps = dVar10;
  pOVar8 = osc::OutboundPacketStream::operator<<(&local_4a8,&local_4c0);
  pOVar8 = osc::OutboundPacketStream::operator<<(pOVar8,(int)(double)local_4b8._0_8_);
  pOVar8 = osc::OutboundPacketStream::operator<<(pOVar8,(int)dVar1);
  pOVar8 = osc::OutboundPacketStream::operator<<
                     (pOVar8,(float)(((double)local_470 / 1000000.0) / quantum));
  pOVar8 = osc::OutboundPacketStream::operator<<(pOVar8,(float)dVar10);
  pOVar8 = osc::OutboundPacketStream::operator<<(pOVar8,"True");
  osc::OutboundPacketStream::operator<<(pOVar8,(MessageTerminator *)&osc::EndMessage);
  this = sender;
  pcVar4 = osc::OutboundPacketStream::Data(&local_4a8);
  sVar9 = osc::OutboundPacketStream::Size(&local_4a8);
  UdpSender::Send(this,pcVar4,(int)sVar9);
  osc::OutboundPacketStream::~OutboundPacketStream(&local_4a8);
  return;
}

Assistant:

void sendTempo(State& state) {
  auto timeline = state.link.captureAppTimeline();
  auto quantum = state.quantum;
  const auto time = state.link.clock().micros();
  const auto tempo = timeline.tempo();
  const auto beats = timeline.beatAtTime(time, quantum);
  const auto phase = timeline.phaseAtTime(time, quantum);
  const auto cycle = beats / quantum;
  const double cps = (timeline.tempo() / quantum) / 60;
  const auto t     = std::chrono::microseconds(time).count();
  static long diff = 0;
  static double last_cps = -1;
  char buffer[OUTPUT_BUFFER_SIZE];
  if (diff == 0) {
    unsigned long milliseconds_since_epoch = 
      std::chrono::duration_cast<std::chrono::milliseconds>
      (std::chrono::system_clock::now().time_since_epoch()).count();
    // POSIX is millis and Link is micros.. Not sure if that `+500` helps
    diff = ((milliseconds_since_epoch*1000 + 500) - t);
  }
  double timetag_ut = ((double) (t + diff)) / ((double) 1000000);
  // latency hack
  timetag_ut -= 0.2;
  int sec = floor(timetag_ut);
  int usec = floor(1000000 * (timetag_ut - sec));
  osc::OutboundPacketStream p( buffer, OUTPUT_BUFFER_SIZE );
  std::cout << "\nnew cps: " << cps << " | last cps: " << last_cps << "\n";
  last_cps = cps;
  p << osc::BeginMessage( "/tempo" )
    << sec << usec
    << (float) cycle << (float) cps << "True" << osc::EndMessage;
  //s.Send( p.Data(), p.Size() );
  sender->Send((char *)p.Data(), p.Size());
}